

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O0

Parse_ast * __thiscall
lambda::parse_from::helper::parse_term(Parse_ast *__return_storage_ptr__,helper *this)

{
  bool bVar1;
  Parse_ast *pPVar2;
  undefined1 local_50 [8];
  optional<lambda::Parse_ast> tm;
  helper *this_local;
  
  tm.super__Optional_base<lambda::Parse_ast,_false,_false>._M_payload.
  super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
  super__Optional_payload_base<lambda::Parse_ast>._48_8_ = this;
  maybe_parse_term((optional<lambda::Parse_ast> *)local_50,this);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_50);
  if (!bVar1) {
    unexpected_thing(this);
  }
  pPVar2 = std::optional<lambda::Parse_ast>::operator*((optional<lambda::Parse_ast> *)local_50);
  lambda::Parse_ast::Parse_ast(__return_storage_ptr__,pPVar2);
  std::optional<lambda::Parse_ast>::~optional((optional<lambda::Parse_ast> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Parse_ast parse_term() {
      if (auto tm = maybe_parse_term()) {
        return std::move(*tm);
      } else {
        unexpected_thing();
      }
    }